

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

bool __thiscall RenX::Server::setUUIDIfDifferent(Server *this,PlayerInfo *player,string_view uuid)

{
  int iVar1;
  size_t __n;
  size_type __rlen;
  bool bVar2;
  
  __n = uuid._M_len;
  if ((player->uuid)._M_string_length == __n) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(uuid._M_str,(player->uuid)._M_dataplus._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (bVar2 == false) {
    setUUID(this,player,uuid);
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool RenX::Server::setUUIDIfDifferent(RenX::PlayerInfo &player, std::string_view uuid) {
	if (player.uuid == uuid) {
		return false;
	}

	setUUID(player, uuid);
	return true;
}